

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::initPh2RowBound(HModel *this,int firstrow,int lastrow)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  int row;
  long lVar7;
  long lVar8;
  double dVar9;
  
  if (firstrow <= lastrow) {
    lVar8 = (long)firstrow;
    pdVar1 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = this->numCol + lVar8;
    pdVar3 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->workRange).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      pdVar3[lVar6 + lVar7] = -pdVar1[lVar8 + lVar7];
      dVar9 = -pdVar2[lVar8 + lVar7];
      pdVar4[lVar6 + lVar7] = dVar9;
      pdVar5[lVar6 + lVar7] = dVar9 - pdVar3[lVar6 + lVar7];
      lVar7 = lVar7 + 1;
    } while ((lastrow - firstrow) + 1 != (int)lVar7);
  }
  return;
}

Assistant:

void HModel::initPh2RowBound(int firstrow, int lastrow) {
  // Copy bounds and compute ranges
  assert(firstrow >= 0);
  assert(lastrow < numRow);
  for (int row = firstrow; row <= lastrow; row++) {
    int var = numCol+row;
    workLower[var] = -rowUpper[row];
    workUpper[var] = -rowLower[row];
    workRange[var] = workUpper[var] - workLower[var];
  }
}